

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

void Fl::remove_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *pCVar1;
  Check **ppCVar2;
  
  if (first_check != (Check *)0x0) {
    ppCVar2 = &first_check;
    pCVar1 = first_check;
    do {
      if ((pCVar1->cb == cb) && (pCVar1->arg == argp)) {
        if (next_check == pCVar1) {
          next_check = pCVar1->next;
        }
        *ppCVar2 = pCVar1->next;
        pCVar1->next = free_check;
        free_check = pCVar1;
      }
      else {
        ppCVar2 = &pCVar1->next;
      }
      pCVar1 = *ppCVar2;
    } while (pCVar1 != (Check *)0x0);
  }
  return;
}

Assistant:

void Fl::remove_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      if (next_check == t) next_check = t->next;
      *p = t->next;
      t->next = free_check;
      free_check = t;
    } else {
      p = &(t->next);
    }
  }
}